

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

uint xmlGlobalRandom(void)

{
  uint uVar1;
  uint ret;
  
  xmlMutexLock(&xmlRngMutex);
  uVar1 = xoroshiro64ss(globalRngState);
  xmlMutexUnlock(&xmlRngMutex);
  return uVar1;
}

Assistant:

unsigned
xmlGlobalRandom(void) {
    unsigned ret;

    xmlMutexLock(&xmlRngMutex);
    ret = xoroshiro64ss(globalRngState);
    xmlMutexUnlock(&xmlRngMutex);

    return(ret);
}